

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basevectors.h
# Opt level: O3

SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
* __thiscall
soplex::
SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
::
multAdd<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>,boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
          (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
           *this,number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                 *xx,
          SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
          *vec)

{
  int *piVar1;
  uint *puVar2;
  char cVar3;
  undefined8 uVar4;
  bool bVar5;
  undefined8 uVar6;
  undefined1 auVar7 [16];
  fpclass_type fVar8;
  int32_t iVar9;
  undefined8 uVar10;
  undefined8 uVar11;
  int iVar12;
  int iVar13;
  ulong uVar14;
  long lVar15;
  long lVar16;
  int *piVar17;
  Nonzero<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *pNVar18;
  cpp_dec_float<50U,_int,_void> *pcVar19;
  ulong uVar20;
  cpp_dec_float<50U,_int,_void> *pcVar21;
  cpp_dec_float<50U,_int,_void> *pcVar22;
  cpp_dec_float<50U,_int,_void> *pcVar23;
  cpp_dec_float<50U,_int,_void> *pcVar24;
  int *piVar25;
  ulong uVar26;
  long lVar27;
  long lVar28;
  Real RVar29;
  type t;
  number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  result;
  cpp_dec_float<50U,_int,_void> local_148;
  SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_110;
  cpp_dec_float<50U,_int,_void> local_108;
  cpp_dec_float<50U,_int,_void> *local_c8;
  long local_c0;
  cpp_dec_float<50U,_int,_void> *local_b8;
  undefined8 uStack_b0;
  uint local_a8 [6];
  undefined8 uStack_90;
  undefined8 local_88;
  SVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
  *local_80;
  long local_78;
  fpclass_type local_6c;
  ulong local_68;
  long local_60;
  uint local_58 [2];
  uint auStack_50 [2];
  uint local_48 [2];
  undefined8 uStack_40;
  undefined8 local_38;
  
  local_b8 = &xx->m_backend;
  if (this[0x38] !=
      (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50u,int,void>,(boost::multiprecision::expression_template_option)0>>
       )0x1) {
    lVar16 = (long)vec->memused;
    if (lVar16 < 1) {
      return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
              *)this;
    }
    uVar14 = lVar16 + 1;
    pcVar21 = &local_148;
    lVar16 = lVar16 * 0x3c;
    do {
      pcVar24 = (cpp_dec_float<50U,_int,_void> *)
                ((long)vec->m_elem[-1].val.m_backend.data._M_elems + lVar16);
      pcVar23 = pcVar24;
      if (pcVar24 == pcVar21) {
        pcVar23 = local_b8;
      }
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems._0_16_ = ZEXT816(0);
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems._24_5_ = 0;
      local_148.data._M_elems[7]._1_3_ = 0;
      local_148.data._M_elems._32_5_ = 0;
      local_148.data._M_elems[9]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      if ((pcVar21 != local_b8) && (pcVar24 != pcVar21)) {
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 8);
        local_148.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.data._M_elems._0_16_ = *(undefined1 (*) [16])(local_b8->data)._M_elems;
        local_148.data._M_elems._16_8_ = *(undefined8 *)((local_b8->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 6);
        local_148.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.exp = local_b8->exp;
        local_148.neg = local_b8->neg;
        local_148.fpclass = local_b8->fpclass;
        local_148.prec_elem = local_b8->prec_elem;
        pcVar23 = pcVar24;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar21,pcVar23);
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=
                ((cpp_dec_float<50U,_int,_void> *)
                 ((long)*(int *)((long)(&vec->m_elem[-1].val + 1) + lVar16) * 0x38 +
                 *(long *)(this + 0x20)),pcVar21);
      uVar14 = uVar14 - 1;
      lVar16 = lVar16 + -0x3c;
    } while (1 < uVar14);
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
  local_78 = *(long *)(this + 0x20);
  local_a8[4] = 0;
  local_a8[5] = 0;
  uStack_90 = 0;
  local_a8[0] = 0;
  local_a8[1] = 0;
  local_a8[2] = 0;
  local_a8[3] = 0;
  local_88 = 0;
  uVar14 = (ulong)vec->memused;
  if ((long)uVar14 < 1) {
    return (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
            *)this;
  }
  uVar20 = 0;
  local_110 = (SSVectorBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
               *)this;
  local_80 = vec;
LAB_0028f7ad:
  uVar26 = uVar14;
  lVar16 = uVar14 * 0x3c;
  local_68 = uVar20;
  do {
    pcVar24 = &local_148;
    pcVar23 = &local_108;
    lVar28 = lVar16 + -0x3c;
    pNVar18 = local_80->m_elem;
    lVar27 = (long)*(int *)((long)(&pNVar18[-1].val + 1) + lVar16);
    lVar15 = lVar27 * 0x38;
    pcVar21 = (cpp_dec_float<50U,_int,_void> *)(local_78 + lVar15);
    if (*(int *)(local_78 + 0x30 + lVar15) == 2) {
LAB_0028f80a:
      pcVar19 = (cpp_dec_float<50U,_int,_void> *)
                ((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16);
      local_108.fpclass = cpp_dec_float_finite;
      local_108.prec_elem = 10;
      local_108.data._M_elems._32_5_ = 0;
      local_108.data._M_elems[9]._1_3_ = 0;
      local_108.exp = 0;
      local_108.neg = false;
      local_108.data._M_elems[4] = 0;
      local_108.data._M_elems[5] = 0;
      local_108.data._M_elems._24_5_ = 0;
      local_108.data._M_elems[7]._1_3_ = 0;
      local_108.data._M_elems[0] = 0;
      local_108.data._M_elems[1] = 0;
      local_108.data._M_elems[2] = 0;
      local_108.data._M_elems[3] = 0;
      pcVar22 = pcVar19;
      if (pcVar19 == pcVar23) {
        pcVar22 = local_b8;
      }
      if (pcVar19 != pcVar23 && pcVar23 != local_b8) {
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 8);
        local_108.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_108.data._M_elems._0_8_ = *(undefined8 *)(local_b8->data)._M_elems;
        local_108.data._M_elems._8_8_ = *(undefined8 *)((local_b8->data)._M_elems + 2);
        local_108.data._M_elems._16_8_ = *(undefined8 *)((local_b8->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 6);
        local_108.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_108.exp = local_b8->exp;
        local_108.neg = local_b8->neg;
        local_108.fpclass = local_b8->fpclass;
        local_108.prec_elem = local_b8->prec_elem;
        pcVar22 = pcVar19;
      }
      local_c0 = lVar28;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar23,pcVar22);
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems._0_16_ = ZEXT816(0);
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems._24_5_ = 0;
      local_148.data._M_elems[7]._1_3_ = 0;
      local_148.data._M_elems._32_5_ = 0;
      local_148.data._M_elems[9]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      if (pcVar24 != pcVar21) {
        uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 8);
        local_148.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.data._M_elems._0_16_ = *(undefined1 (*) [16])(pcVar21->data)._M_elems;
        local_148.data._M_elems._16_8_ = *(undefined8 *)((pcVar21->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((pcVar21->data)._M_elems + 6);
        local_148.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.exp = pcVar21->exp;
        local_148.neg = pcVar21->neg;
        local_148.fpclass = pcVar21->fpclass;
        local_148.prec_elem = pcVar21->prec_elem;
      }
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator+=(pcVar24,pcVar23);
      uVar10 = local_148._48_8_;
      bVar5 = local_148.neg;
      iVar12 = local_148.exp;
      auVar7 = (undefined1  [16])local_148.data._M_elems._0_16_;
      uStack_90 = CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
      local_a8[0] = local_148.data._M_elems[0];
      local_a8[1] = local_148.data._M_elems[1];
      local_a8[2] = local_148.data._M_elems[2];
      local_a8[3] = local_148.data._M_elems[3];
      local_a8[4] = local_148.data._M_elems[4];
      local_a8[5] = local_148.data._M_elems[5];
      local_88 = CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
      fVar8 = local_148.fpclass;
      iVar9 = local_148.prec_elem;
      local_148.data._M_elems._0_16_ = auVar7;
      RVar29 = Tolerances::epsilon((local_110->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      uVar11 = local_148._48_8_;
      local_108.data._M_elems._32_5_ = SUB85(local_88,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_88 >> 0x28);
      local_108.data._M_elems[4] = local_a8[4];
      local_108.data._M_elems[5] = local_a8[5];
      local_108.data._M_elems._24_5_ = SUB85(uStack_90,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_90 >> 0x28);
      local_108.data._M_elems[0] = local_a8[0];
      local_108.data._M_elems[1] = local_a8[1];
      uVar6 = local_108.data._M_elems._0_8_;
      local_108.data._M_elems[2] = local_a8[2];
      local_108.data._M_elems[3] = local_a8[3];
      local_108.exp = iVar12;
      local_108.neg = bVar5;
      local_148.fpclass = (fpclass_type)uVar10;
      local_148.prec_elem = SUB84(uVar10,4);
      uVar4._0_4_ = local_148.fpclass;
      uVar4._4_4_ = local_148.prec_elem;
      local_148.fpclass = (fpclass_type)uVar10;
      local_148.prec_elem = SUB84(uVar10,4);
      local_108.fpclass = local_148.fpclass;
      local_108.prec_elem = local_148.prec_elem;
      if ((bVar5 == true) &&
         (local_108.data._M_elems[0] = (uint)local_a8._0_8_,
         local_108.data._M_elems[0] != 0 || fVar8 != cpp_dec_float_finite)) {
        local_108.neg = false;
      }
      local_148._48_8_ = uVar11;
      local_108.data._M_elems._0_8_ = uVar6;
      uVar10 = uVar4;
      if ((fVar8 == cpp_dec_float_NaN) || (uVar10 = local_108._48_8_, NAN(RVar29))) break;
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems[0] = 0;
      local_148.data._M_elems[1] = 0;
      local_148.data._M_elems[2] = 0;
      local_148.data._M_elems[3] = 0;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems._24_5_ = 0;
      local_148.data._M_elems[7]._1_3_ = 0;
      local_148.data._M_elems._32_5_ = 0;
      local_148.data._M_elems[9]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      local_108._48_8_ = uVar4;
      local_c8 = pcVar21;
      boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                ((cpp_dec_float<50u,int,void> *)&local_148,RVar29);
      pcVar21 = local_c8;
      iVar13 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (&local_108,&local_148);
      uVar10 = local_108._48_8_;
      if (iVar13 < 1) break;
      *(undefined8 *)((pcVar21->data)._M_elems + 8) = local_88;
      *(undefined8 *)((pcVar21->data)._M_elems + 4) = local_a8._16_8_;
      *(undefined8 *)((pcVar21->data)._M_elems + 6) = uStack_90;
      *(undefined8 *)(pcVar21->data)._M_elems = local_a8._0_8_;
      *(undefined8 *)((pcVar21->data)._M_elems + 2) = local_a8._8_8_;
      pcVar21->exp = iVar12;
      pcVar21->neg = bVar5;
      pcVar21->fpclass = fVar8;
      pcVar21->prec_elem = iVar9;
      lVar28 = local_c0;
      uVar10 = local_108.data._M_elems._8_8_;
      uVar11 = local_108.data._M_elems._16_8_;
    }
    else {
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::cpp_dec_float<long_long>
                (pcVar24,0,(type *)0x0);
      iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                         (pcVar21,pcVar24);
      pNVar18 = local_80->m_elem;
      if (iVar12 != 0) goto LAB_0028f80a;
      pcVar19 = (cpp_dec_float<50U,_int,_void> *)
                ((long)pNVar18[-1].val.m_backend.data._M_elems + lVar16);
      local_148.fpclass = cpp_dec_float_finite;
      local_148.prec_elem = 10;
      local_148.data._M_elems._32_5_ = 0;
      local_148.data._M_elems[9]._1_3_ = 0;
      local_148.exp = 0;
      local_148.neg = false;
      local_148.data._M_elems[4] = 0;
      local_148.data._M_elems[5] = 0;
      local_148.data._M_elems._24_5_ = 0;
      local_148.data._M_elems[7]._1_3_ = 0;
      local_148.data._M_elems._0_16_ = ZEXT816(0);
      pcVar22 = pcVar19;
      if (pcVar19 == pcVar24) {
        pcVar22 = local_b8;
      }
      if (pcVar19 != pcVar24 && pcVar24 != local_b8) {
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 8);
        local_148.data._M_elems._32_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[9]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.data._M_elems._0_16_ = *(undefined1 (*) [16])(local_b8->data)._M_elems;
        local_148.data._M_elems._16_8_ = *(undefined8 *)((local_b8->data)._M_elems + 4);
        uVar4 = *(undefined8 *)((local_b8->data)._M_elems + 6);
        local_148.data._M_elems._24_5_ = SUB85(uVar4,0);
        local_148.data._M_elems[7]._1_3_ = (undefined3)((ulong)uVar4 >> 0x28);
        local_148.exp = local_b8->exp;
        local_148.neg = local_b8->neg;
        local_148.fpclass = local_b8->fpclass;
        local_148.prec_elem = local_b8->prec_elem;
        pcVar22 = pcVar19;
      }
      local_60 = lVar27;
      boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator*=(pcVar24,pcVar22);
      bVar5 = local_148.neg;
      auVar7 = (undefined1  [16])local_148.data._M_elems._0_16_;
      uStack_90 = CONCAT35(local_148.data._M_elems[7]._1_3_,local_148.data._M_elems._24_5_);
      local_a8[0] = local_148.data._M_elems[0];
      local_a8[1] = local_148.data._M_elems[1];
      local_a8[2] = local_148.data._M_elems[2];
      local_a8[3] = local_148.data._M_elems[3];
      local_a8[4] = local_148.data._M_elems[4];
      local_a8[5] = local_148.data._M_elems[5];
      local_88 = CONCAT35(local_148.data._M_elems[9]._1_3_,local_148.data._M_elems._32_5_);
      local_c0 = CONCAT44(local_c0._4_4_,local_148.exp);
      local_6c = local_148.fpclass;
      local_c8 = (cpp_dec_float<50U,_int,_void> *)CONCAT44(local_c8._4_4_,local_148.prec_elem);
      local_148.data._M_elems._0_16_ = auVar7;
      RVar29 = Tolerances::epsilon((local_110->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      fVar8 = local_6c;
      local_108.data._M_elems._32_5_ = SUB85(local_88,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_88 >> 0x28);
      uVar6._0_4_ = local_a8[0];
      uVar6._4_4_ = local_a8[1];
      uVar10._0_4_ = local_a8[2];
      uVar10._4_4_ = local_a8[3];
      uVar11._0_4_ = local_a8[4];
      uVar11._4_4_ = local_a8[5];
      local_108.data._M_elems[4] = local_a8[4];
      local_108.data._M_elems[5] = local_a8[5];
      local_108.data._M_elems._24_5_ = SUB85(uStack_90,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_90 >> 0x28);
      local_108.data._M_elems[0] = local_a8[0];
      local_108.data._M_elems[1] = local_a8[1];
      uVar4 = local_108.data._M_elems._0_8_;
      local_108.data._M_elems[2] = local_a8[2];
      local_108.data._M_elems[3] = local_a8[3];
      local_108.exp = (int)local_c0;
      local_108.neg = bVar5;
      local_108.prec_elem = (int32_t)local_c8;
      local_108.fpclass = local_6c;
      if ((bVar5 == true) &&
         (local_108.data._M_elems[0] = (uint)local_a8._0_8_,
         local_108.data._M_elems[0] != 0 || local_6c != cpp_dec_float_finite)) {
        local_108.neg = false;
      }
      local_108.data._M_elems._0_8_ = uVar6;
      if ((local_6c != cpp_dec_float_NaN) &&
         (local_108.data._M_elems._0_8_ = uVar4, uVar10 = local_108.data._M_elems._8_8_,
         uVar11 = local_108.data._M_elems._16_8_, !NAN(RVar29))) {
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems._24_5_ = 0;
        local_148.data._M_elems[7]._1_3_ = 0;
        local_148.data._M_elems._32_5_ = 0;
        local_148.data._M_elems[9]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)pcVar24,RVar29);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (pcVar23,pcVar24);
        uVar10 = local_108.data._M_elems._8_8_;
        uVar11 = local_108.data._M_elems._16_8_;
        if (0 < iVar12) {
          *(undefined8 *)((pcVar21->data)._M_elems + 8) = local_88;
          *(undefined8 *)((pcVar21->data)._M_elems + 4) = local_a8._16_8_;
          *(undefined8 *)((pcVar21->data)._M_elems + 6) = uStack_90;
          *(undefined8 *)(pcVar21->data)._M_elems = local_a8._0_8_;
          *(undefined8 *)((pcVar21->data)._M_elems + 2) = local_a8._8_8_;
          pcVar21->exp = (int)local_c0;
          pcVar21->neg = bVar5;
          pcVar21->fpclass = fVar8;
          pcVar21->prec_elem = (int32_t)local_c8;
          iVar12 = (local_110->super_IdxSet).num;
          (local_110->super_IdxSet).num = iVar12 + 1;
          (local_110->super_IdxSet).idx[iVar12] = (int)local_60;
        }
      }
    }
    local_108.data._M_elems._16_8_ = uVar11;
    local_108.data._M_elems._8_8_ = uVar10;
    bVar5 = uVar26 < 2;
    uVar26 = uVar26 - 1;
    lVar16 = lVar28;
    if (bVar5) {
      if ((local_68 & 1) == 0) {
        return local_110;
      }
      goto LAB_0028fddd;
    }
  } while( true );
  local_108._48_8_ = uVar10;
  boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
            ((cpp_dec_float<50u,int,void> *)pcVar21,1e-100);
  uVar14 = uVar26 - 1;
  uVar20 = CONCAT71((int7)((ulong)pcVar19 >> 8),1);
  if (uVar26 < 2) goto LAB_0028fddd;
  goto LAB_0028f7ad;
LAB_0028fddd:
  piVar17 = (local_110->super_IdxSet).idx;
  lVar16 = (long)(local_110->super_IdxSet).num;
  piVar25 = piVar17;
  if (0 < lVar16) {
    piVar1 = piVar17 + lVar16;
    do {
      lVar16 = (long)*piVar17 * 0x38;
      iVar12 = *(int *)(local_78 + 0x28 + lVar16);
      cVar3 = *(char *)(local_78 + 0x2c + lVar16);
      local_38 = *(undefined8 *)(local_78 + 0x20 + lVar16);
      local_58 = *(uint (*) [2])(local_78 + lVar16);
      auStack_50 = *(uint (*) [2])((uint *)(local_78 + lVar16) + 2);
      puVar2 = (uint *)(local_78 + 0x10 + lVar16);
      local_48 = *(uint (*) [2])puVar2;
      uStack_40 = *(undefined8 *)(puVar2 + 2);
      uVar4 = *(undefined8 *)(local_78 + 0x30 + lVar16);
      uStack_b0 = 0;
      local_b8 = (cpp_dec_float<50U,_int,_void> *)uVar4;
      RVar29 = Tolerances::epsilon((local_110->_tolerances).
                                   super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr);
      local_108.data._M_elems._32_5_ = SUB85(local_38,0);
      local_108.data._M_elems[9]._1_3_ = (undefined3)((ulong)local_38 >> 0x28);
      local_108.data._M_elems[4] = local_48[0];
      local_108.data._M_elems[5] = local_48[1];
      local_108.data._M_elems._24_5_ = SUB85(uStack_40,0);
      local_108.data._M_elems[7]._1_3_ = (undefined3)((ulong)uStack_40 >> 0x28);
      local_108.data._M_elems[0] = local_58[0];
      local_108.data._M_elems[1] = local_58[1];
      uVar10 = local_108.data._M_elems._0_8_;
      local_108.data._M_elems[2] = auStack_50[0];
      local_108.data._M_elems[3] = auStack_50[1];
      local_108.neg = (bool)cVar3;
      if ((cVar3 == '\x01') &&
         (local_108.data._M_elems[0] = local_58[0],
         local_108.data._M_elems[0] != 0 || (fpclass_type)local_b8 != cpp_dec_float_finite)) {
        local_108.neg = false;
      }
      local_108.data._M_elems._0_8_ = uVar10;
      local_108.exp = iVar12;
      local_108._48_8_ = uVar4;
      if (((fpclass_type)local_b8 == cpp_dec_float_NaN) || (NAN(RVar29))) {
LAB_0028ff09:
        boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::operator=
                  ((cpp_dec_float<50U,_int,_void> *)((long)*piVar17 * 0x38 + local_78),0);
      }
      else {
        local_148.fpclass = cpp_dec_float_finite;
        local_148.prec_elem = 10;
        local_148.data._M_elems[0] = 0;
        local_148.data._M_elems[1] = 0;
        local_148.data._M_elems[2] = 0;
        local_148.data._M_elems[3] = 0;
        local_148.data._M_elems[4] = 0;
        local_148.data._M_elems[5] = 0;
        local_148.data._M_elems._24_5_ = 0;
        local_148.data._M_elems[7]._1_3_ = 0;
        local_148.data._M_elems._32_5_ = 0;
        local_148.data._M_elems[9]._1_3_ = 0;
        local_148.exp = 0;
        local_148.neg = false;
        boost::multiprecision::backends::cpp_dec_float<50u,int,void>::operator=
                  ((cpp_dec_float<50u,int,void> *)&local_148,RVar29);
        iVar12 = boost::multiprecision::backends::cpp_dec_float<50U,_int,_void>::compare
                           (&local_108,&local_148);
        if (iVar12 < 1) goto LAB_0028ff09;
        *piVar25 = *piVar17;
        piVar25 = piVar25 + 1;
      }
      piVar17 = piVar17 + 1;
    } while (piVar17 < piVar1);
    piVar17 = (local_110->super_IdxSet).idx;
  }
  (local_110->super_IdxSet).num = (int)((ulong)((long)piVar25 - (long)piVar17) >> 2);
  return local_110;
}

Assistant:

inline
SSVectorBase<R>& SSVectorBase<R>::multAdd(S xx, const SVectorBase<T>& vec)
{
   if(isSetup())
   {
      R* v = VectorBase<R>::val.data();
      R x;
      bool adjust = false;
      int j;

      for(int i = vec.size() - 1; i >= 0; --i)
      {
         j = vec.index(i);

         if(v[j] != 0)
         {
            x = v[j] + xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
               v[j] = x;
            else
            {
               adjust = true;
               v[j] = SOPLEX_VECTOR_MARKER;
            }
         }
         else
         {
            x = xx * vec.value(i);

            if(isNotZero(x, this->tolerances()->epsilon()))
            {
               v[j] = x;
               addIdx(j);
            }
         }
      }

      if(adjust)
      {
         int* iptr = idx;
         int* iiptr = idx;
         int* endptr = idx + num;

         for(; iptr < endptr; ++iptr)
         {
            x = v[*iptr];

            if(isNotZero(x, this->tolerances()->epsilon()))
               *iiptr++ = *iptr;
            else
               v[*iptr] = 0;
         }

         num = int(iiptr - idx);
      }
   }
   else
      VectorBase<R>::multAdd(xx, vec);

   assert(isConsistent());

   return *this;
}